

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_posix_collate.cpp
# Opt level: O2

void test_one<wchar_t>(locale *l,string *ia,string *ib,int diff)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *prVar4;
  collate *pcVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  string local_c0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> b;
  size_type local_98;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> a;
  size_type local_78;
  allocator local_60 [32];
  locale local_40 [8];
  locale local_38 [8];
  
  std::locale::locale(local_38,l);
  to_correct_string<wchar_t>((string *)&a,(locale *)ia);
  std::locale::~locale(local_38);
  std::locale::locale(local_40,l);
  to_correct_string<wchar_t>((string *)&b,(locale *)ib);
  std::locale::~locale(local_40);
  if (diff < 0) {
    test_counter = test_counter + 1;
    bVar1 = std::locale::operator()(l,&a,&b);
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x29);
      poVar3 = std::operator<<(poVar3," l(a,b)");
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar2 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar2;
      if (bVar1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_c0,"Error limits reached, stopping unit test",local_60);
        booster::runtime_error::runtime_error(prVar4,&local_c0);
        __cxa_throw(prVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    test_counter = test_counter + 1;
    bVar1 = std::locale::operator()(l,&b,&a);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x2a);
      poVar3 = std::operator<<(poVar3," !l(b,a)");
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar2 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar2;
      if (bVar1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_c0,"Error limits reached, stopping unit test",local_60);
        booster::runtime_error::runtime_error(prVar4,&local_c0);
        __cxa_throw(prVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
  }
  else {
    test_counter = test_counter + 1;
    if (diff == 0) {
      bVar1 = std::locale::operator()(l,&a,&b);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x2d);
        poVar3 = std::operator<<(poVar3," !l(a,b)");
        std::endl<char,std::char_traits<char>>(poVar3);
        iVar2 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar2;
        if (bVar1) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_c0,"Error limits reached, stopping unit test",local_60);
          booster::runtime_error::runtime_error(prVar4,&local_c0);
          __cxa_throw(prVar4,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      bVar1 = std::locale::operator()(l,&b,&a);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x2e);
        poVar3 = std::operator<<(poVar3," !l(b,a)");
        std::endl<char,std::char_traits<char>>(poVar3);
        iVar2 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar2;
        if (bVar1) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_c0,"Error limits reached, stopping unit test",local_60);
          booster::runtime_error::runtime_error(prVar4,&local_c0);
          __cxa_throw(prVar4,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    else {
      bVar1 = std::locale::operator()(l,&a,&b);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x31);
        poVar3 = std::operator<<(poVar3," !l(a,b)");
        std::endl<char,std::char_traits<char>>(poVar3);
        iVar2 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar2;
        if (bVar1) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_c0,"Error limits reached, stopping unit test",local_60);
          booster::runtime_error::runtime_error(prVar4,&local_c0);
          __cxa_throw(prVar4,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      bVar1 = std::locale::operator()(l,&b,&a);
      if (!bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x32);
        poVar3 = std::operator<<(poVar3," l(b,a)");
        std::endl<char,std::char_traits<char>>(poVar3);
        iVar2 = error_counter + 1;
        bVar1 = 0x14 < error_counter;
        error_counter = iVar2;
        if (bVar1) {
          prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string
                    ((string *)&local_c0,"Error limits reached, stopping unit test",local_60);
          booster::runtime_error::runtime_error(prVar4,&local_c0);
          __cxa_throw(prVar4,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
  }
  pcVar5 = std::use_facet<std::__cxx11::collate<wchar_t>>(l);
  test_counter = test_counter + 1;
  iVar2 = (**(code **)(*(long *)pcVar5 + 0x10))(pcVar5,_a,_a + local_78 * 4,_b,_b + local_98 * 4);
  if (iVar2 != diff) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x37);
    poVar3 = std::operator<<(poVar3,
                             " diff == col.compare(a.c_str(),a.c_str()+a.size(),b.c_str(),b.c_str()+b.size())"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar2;
    if (bVar1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_c0,"Error limits reached, stopping unit test",local_60);
      booster::runtime_error::runtime_error(prVar4,&local_c0);
      __cxa_throw(prVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  test_counter = test_counter + 1;
  (**(code **)(*(long *)pcVar5 + 0x18))(&local_c0,pcVar5,_a,_a + local_78 * 4);
  (**(code **)(*(long *)pcVar5 + 0x18))(local_60,pcVar5,_b,_b + local_98 * 4);
  iVar2 = std::__cxx11::wstring::compare((wstring *)&local_c0);
  uVar8 = 0xffffffff;
  if (-1 < iVar2) {
    uVar8 = (uint)(iVar2 != 0);
  }
  std::__cxx11::wstring::~wstring((wstring *)local_60);
  std::__cxx11::wstring::~wstring((wstring *)&local_c0);
  if (uVar8 != diff) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x38);
    poVar3 = std::operator<<(poVar3,
                             " diff == get_sign(col.transform(a.c_str(),a.c_str()+a.size()).compare(col.transform(b.c_str(),b.c_str()+b.size())))"
                            );
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar2 = error_counter + 1;
    bVar1 = 0x14 < error_counter;
    error_counter = iVar2;
    if (bVar1) {
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_c0,"Error limits reached, stopping unit test",local_60);
      booster::runtime_error::runtime_error(prVar4,&local_c0);
      __cxa_throw(prVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  if (diff == 0) {
    test_counter = test_counter + 1;
    lVar6 = (**(code **)(*(long *)pcVar5 + 0x20))(pcVar5,_a,_a + local_78 * 4);
    lVar7 = (**(code **)(*(long *)pcVar5 + 0x20))(pcVar5,_b,_b + local_98 * 4);
    if (lVar6 != lVar7) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x3a);
      poVar3 = std::operator<<(poVar3,
                               " col.hash(a.c_str(),a.c_str()+a.size()) == col.hash(b.c_str(),b.c_str()+b.size())"
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      iVar2 = error_counter + 1;
      bVar1 = 0x14 < error_counter;
      error_counter = iVar2;
      if (bVar1) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&local_c0,"Error limits reached, stopping unit test",local_60);
        booster::runtime_error::runtime_error(prVar4,&local_c0);
        __cxa_throw(prVar4,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
  }
  std::__cxx11::wstring::~wstring((wstring *)&b);
  std::__cxx11::wstring::~wstring((wstring *)&a);
  return;
}

Assistant:

void test_one(std::locale const &l,std::string ia,std::string ib,int diff)
{
    std::basic_string<CharType> a=to_correct_string<CharType>(ia,l);
    std::basic_string<CharType> b=to_correct_string<CharType>(ib,l);
    if(diff < 0) {
        TEST(l(a,b));
        TEST(!l(b,a));
    }
    else if(diff == 0) {
        TEST(!l(a,b));
        TEST(!l(b,a));
    }
    else {
        TEST(!l(a,b));
        TEST(l(b,a));
    }
    
    std::collate<CharType> const &col = std::use_facet<std::collate<CharType> >(l);

    TEST(diff == col.compare(a.c_str(),a.c_str()+a.size(),b.c_str(),b.c_str()+b.size()));
    TEST(diff == get_sign(col.transform(a.c_str(),a.c_str()+a.size()).compare(col.transform(b.c_str(),b.c_str()+b.size()))));
    if(diff == 0) {
        TEST(col.hash(a.c_str(),a.c_str()+a.size()) == col.hash(b.c_str(),b.c_str()+b.size()));
    }
}